

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void InterruptRPC(void)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 local_21;
  undefined1 *local_20;
  long local_18;
  
  local_18 = in_FS_OFFSET[5];
  local_20 = &local_21;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_20;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar3 = pthread_once(&InterruptRPC::g_rpc_interrupt_flag._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      return;
    }
  }
  else if (in_FS_OFFSET[5] == local_18) {
    uVar4 = std::__throw_system_error(iVar3);
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

void InterruptRPC()
{
    static std::once_flag g_rpc_interrupt_flag;
    // This function could be called twice if the GUI has been started with -server=1.
    std::call_once(g_rpc_interrupt_flag, []() {
        LogDebug(BCLog::RPC, "Interrupting RPC\n");
        // Interrupt e.g. running longpolls
        g_rpc_running = false;
    });
}